

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNnameConstraintsTest17<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section13InvalidDNnameConstraintsTest17
          (Section13InvalidDNnameConstraintsTest17<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNnameConstraintsTest17) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "nameConstraintsDN3CACert",
      "nameConstraintsDN3subCA2Cert", "InvalidDNnameConstraintsTest17EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN3CACRL",
                              "nameConstraintsDN3subCA2CRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.17";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}